

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  char *__s2;
  byte bVar2;
  greatest_test_res gVar3;
  flow_t fVar4;
  int iVar5;
  int iVar6;
  uint i_00;
  uchar uVar7;
  int iVar8;
  uint uVar9;
  int32_t i;
  int iVar10;
  int32_t j;
  int iVar11;
  ulong uVar12;
  int32_t nnodes;
  int iVar13;
  int32_t nnodes_00;
  uint uVar14;
  bool bVar15;
  int local_bc;
  FlowNetwork net;
  MaxFlowResult result;
  MaxFlow mf;
  
  GREATEST_INIT();
  bVar2 = greatest_info.flags;
  uVar7 = greatest_info.verbosity;
  for (iVar10 = 1; iVar10 < argc; iVar10 = iVar10 + 1) {
    __s2 = argv[iVar10];
    if (*__s2 == '-') {
      bVar1 = __s2[1];
      switch(bVar1) {
      case 0x65:
        greatest_info.exact_name_match = '\x01';
        break;
      case 0x66:
        bVar2 = bVar2 | 1;
        greatest_info.flags = bVar2;
        break;
      case 0x67:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x75:
      case 0x77:
switchD_00101d26_caseD_67:
        iVar10 = strncmp("--help",__s2,6);
        if (iVar10 == 0) {
switchD_00101d26_caseD_68:
          greatest_usage(*argv);
          exit(0);
        }
        uVar14 = bVar1 - 0x2d;
        if (uVar14 == 0) {
          uVar14 = (uint)(byte)__s2[2];
        }
        if (uVar14 != 0) {
          fprintf(_stdout,"Unknown argument \'%s\'\n",__s2);
LAB_001039c2:
          greatest_usage(*argv);
          exit(1);
        }
        goto LAB_00101dd8;
      case 0x68:
        goto switchD_00101d26_caseD_68;
      case 0x6c:
        bVar2 = bVar2 | 2;
        greatest_info.flags = bVar2;
        break;
      case 0x73:
      case 0x74:
      case 0x78:
        iVar8 = iVar10 + 1;
        if (argc <= iVar8) goto LAB_001039c2;
        if (5 < bVar1 - 0x73) goto switchD_00101d26_caseD_67;
        switch((uint)bVar1) {
        case 0x73:
          greatest_info.suite_filter = argv[iVar8];
          iVar10 = iVar8;
          break;
        case 0x74:
          greatest_info.test_filter = argv[iVar8];
          iVar10 = iVar8;
          break;
        default:
          goto switchD_00101d26_caseD_67;
        case 0x76:
          goto switchD_00101d26_caseD_76;
        case 0x78:
          greatest_info.test_exclude = argv[iVar8];
          iVar10 = iVar8;
        }
        break;
      case 0x76:
switchD_00101d26_caseD_76:
        uVar7 = uVar7 + '\x01';
        greatest_info.verbosity = uVar7;
        break;
      default:
        if (bVar1 != 0x61) goto switchD_00101d26_caseD_67;
        bVar2 = bVar2 | 4;
        greatest_info.flags = bVar2;
      }
    }
  }
LAB_00101dd8:
  iVar10 = greatest_test_pre("weird_network");
  if (iVar10 == 1) {
    net.nnodes = 0;
    net._4_4_ = 0;
    net.caps = (flow_t *)0x0;
    mf.payload._32_8_ = 0;
    mf.payload.field_1.list = (int32_t *)0x0;
    mf.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    mf.payload.field_1.curr_neigh = (int32_t *)0x0;
    mf.payload.field_1.flows = (flow_t *)0x0;
    mf.payload.field_1.height = (int32_t *)0x0;
    mf.nnodes = 0;
    mf.s = 0;
    mf.t = 0;
    mf.kind = MAXFLOW_ALGO_INVALID;
    result.nnodes = 0;
    result.s = 0;
    result.t = 0;
    result.maxflow = 0;
    result.colors = (int32_t *)0x0;
    flow_network_create(&net,4);
    max_flow_create(&mf,4,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&result,4);
    flow_net_set_cap(&net,1,2,0x28);
    flow_net_set_cap(&net,2,1,0x3c);
    flow_net_set_cap(&net,1,0,0x50);
    flow_net_set_cap(&net,0,1,0x28);
    flow_net_set_cap(&net,1,3,0x28);
    flow_net_set_cap(&net,3,1,0x14);
    flow_net_set_cap(&net,2,0,0x14);
    flow_net_set_cap(&net,0,2,0x14);
    flow_net_set_cap(&net,3,0,0x3c);
    flow_net_set_cap(&net,0,3,0x50);
    max_flow_single_pair(&net,&mf,1,0,&result);
    gVar3 = validate_with_slow_max_flow(&net,1,0,&result);
    if (gVar3 == GREATEST_TEST_RES_PASS) {
      max_flow_result_destroy(&result);
      max_flow_destroy(&mf);
      flow_network_destroy(&net);
      greatest_info.msg = (char *)0x0;
      iVar10 = 0;
    }
    else {
      iVar10 = -1;
    }
    greatest_test_post(iVar10);
  }
  iVar10 = greatest_test_pre("weird_network2");
  if (iVar10 == 1) {
    net.nnodes = 0;
    net._4_4_ = 0;
    net.caps = (flow_t *)0x0;
    mf.payload._32_8_ = 0;
    mf.payload.field_1.list = (int32_t *)0x0;
    mf.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    mf.payload.field_1.curr_neigh = (int32_t *)0x0;
    mf.payload.field_1.flows = (flow_t *)0x0;
    mf.payload.field_1.height = (int32_t *)0x0;
    mf.nnodes = 0;
    mf.s = 0;
    mf.t = 0;
    mf.kind = MAXFLOW_ALGO_INVALID;
    result.nnodes = 0;
    result.s = 0;
    result.t = 0;
    result.maxflow = 0;
    result.colors = (int32_t *)0x0;
    flow_network_create(&net,4);
    max_flow_create(&mf,4,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&result,4);
    flow_net_set_cap(&net,0,0,0);
    flow_net_set_cap(&net,0,1,0x50);
    flow_net_set_cap(&net,0,2,0x50);
    flow_net_set_cap(&net,0,3,0);
    flow_net_set_cap(&net,1,0,0);
    flow_net_set_cap(&net,1,1,0);
    flow_net_set_cap(&net,1,2,0);
    flow_net_set_cap(&net,1,3,0);
    flow_net_set_cap(&net,2,0,0x14);
    flow_net_set_cap(&net,2,1,0x3c);
    flow_net_set_cap(&net,2,2,0);
    flow_net_set_cap(&net,2,3,0x3c);
    flow_net_set_cap(&net,3,0,0);
    flow_net_set_cap(&net,3,1,0x14);
    flow_net_set_cap(&net,3,2,0x50);
    flow_net_set_cap(&net,3,3,0);
    max_flow_single_pair(&net,&mf,2,3,&result);
    gVar3 = validate_with_slow_max_flow(&net,2,3,&result);
    if (gVar3 == GREATEST_TEST_RES_PASS) {
      max_flow_result_destroy(&result);
      max_flow_destroy(&mf);
      flow_network_destroy(&net);
      greatest_info.msg = (char *)0x0;
      iVar10 = 0;
    }
    else {
      iVar10 = -1;
    }
    greatest_test_post(iVar10);
  }
  iVar10 = greatest_test_pre("weird_network3");
  if (iVar10 == 1) {
    net.nnodes = 0;
    net._4_4_ = 0;
    net.caps = (flow_t *)0x0;
    mf.payload._32_8_ = 0;
    mf.payload.field_1.list = (int32_t *)0x0;
    mf.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    mf.payload.field_1.curr_neigh = (int32_t *)0x0;
    mf.payload.field_1.flows = (flow_t *)0x0;
    mf.payload.field_1.height = (int32_t *)0x0;
    mf.nnodes = 0;
    mf.s = 0;
    mf.t = 0;
    mf.kind = MAXFLOW_ALGO_INVALID;
    result.nnodes = 0;
    result.s = 0;
    result.t = 0;
    result.maxflow = 0;
    result.colors = (int32_t *)0x0;
    flow_network_create(&net,5);
    max_flow_create(&mf,5,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&result,5);
    flow_net_set_cap(&net,0,0,0);
    flow_net_set_cap(&net,0,1,0x28);
    flow_net_set_cap(&net,0,2,0x50);
    flow_net_set_cap(&net,0,3,0x3c);
    flow_net_set_cap(&net,0,4,0x50);
    flow_net_set_cap(&net,1,0,0x50);
    flow_net_set_cap(&net,1,1,0);
    flow_net_set_cap(&net,1,2,0x14);
    flow_net_set_cap(&net,1,3,0x28);
    flow_net_set_cap(&net,1,4,0x50);
    flow_net_set_cap(&net,2,0,0x50);
    flow_net_set_cap(&net,2,1,0x3c);
    flow_net_set_cap(&net,2,2,0);
    flow_net_set_cap(&net,2,3,0x3c);
    flow_net_set_cap(&net,2,4,0x50);
    flow_net_set_cap(&net,3,0,0x28);
    flow_net_set_cap(&net,3,1,0x3c);
    flow_net_set_cap(&net,3,2,0x14);
    flow_net_set_cap(&net,3,3,0);
    flow_net_set_cap(&net,3,4,0x14);
    flow_net_set_cap(&net,4,0,0);
    flow_net_set_cap(&net,4,1,0x28);
    flow_net_set_cap(&net,4,2,0x50);
    flow_net_set_cap(&net,4,3,0x50);
    flow_net_set_cap(&net,4,4,0);
    max_flow_single_pair(&net,&mf,0,2,&result);
    gVar3 = validate_with_slow_max_flow(&net,0,2,&result);
    if (gVar3 == GREATEST_TEST_RES_PASS) {
      max_flow_result_destroy(&result);
      max_flow_destroy(&mf);
      flow_network_destroy(&net);
      greatest_info.msg = (char *)0x0;
      iVar10 = 0;
    }
    else {
      iVar10 = -1;
    }
    greatest_test_post(iVar10);
  }
  iVar10 = greatest_test_pre("CLRS_network");
  if (iVar10 == 1) {
    net.nnodes = 0;
    net._4_4_ = 0;
    net.caps = (flow_t *)0x0;
    mf.payload._32_8_ = 0;
    mf.payload.field_1.list = (int32_t *)0x0;
    mf.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    mf.payload.field_1.curr_neigh = (int32_t *)0x0;
    mf.payload.field_1.flows = (flow_t *)0x0;
    mf.payload.field_1.height = (int32_t *)0x0;
    mf.nnodes = 0;
    mf.s = 0;
    mf.t = 0;
    mf.kind = MAXFLOW_ALGO_INVALID;
    result.nnodes = 0;
    result.s = 0;
    result.t = 0;
    result.maxflow = 0;
    result.colors = (int32_t *)0x0;
    flow_network_create(&net,6);
    max_flow_create(&mf,6,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&result,6);
    flow_net_set_cap(&net,0,1,0x10);
    flow_net_set_cap(&net,0,2,0xd);
    flow_net_set_cap(&net,1,2,10);
    flow_net_set_cap(&net,2,1,0x28);
    flow_net_set_cap(&net,1,3,0xc);
    flow_net_set_cap(&net,3,2,9);
    flow_net_set_cap(&net,2,4,0xe);
    flow_net_set_cap(&net,4,3,7);
    flow_net_set_cap(&net,3,5,0x14);
    flow_net_set_cap(&net,4,5,4);
    fVar4 = max_flow_single_pair(&net,&mf,0,5,&result);
    if (fVar4 == 0x17) {
      if (*result.colors != 0) {
        greatest_info.fail_line = 0x107;
        greatest_info.msg = "BLACK != result.colors[0]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102527;
      }
      if (result.colors[1] != 0) {
        greatest_info.fail_line = 0x108;
        greatest_info.msg = "BLACK != result.colors[1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_00102527;
      }
      if (result.colors[2] != 0) {
        greatest_info.fail_line = 0x109;
        greatest_info.msg = "BLACK != result.colors[2]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_00102527;
      }
      if (result.colors[3] != 1) {
        greatest_info.fail_line = 0x10a;
        greatest_info.msg = "WHITE != result.colors[3]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_00102527;
      }
      if (result.colors[4] != 0) {
        greatest_info.fail_line = 0x10b;
        greatest_info.msg = "BLACK != result.colors[4]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_00102527;
      }
      greatest_info.assertions = greatest_info.assertions + 7;
      if (result.colors[5] != 1) {
        greatest_info.fail_line = 0x10c;
        greatest_info.msg = "WHITE != result.colors[5]";
        goto LAB_00102527;
      }
      iVar10 = 0;
      gVar3 = validate_with_slow_max_flow(&net,0,5,&result);
      if (gVar3 != GREATEST_TEST_RES_PASS) goto LAB_0010253b;
      max_flow_result_destroy(&result);
      max_flow_destroy(&mf);
      flow_network_destroy(&net);
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_line = 0x106;
      greatest_info.msg = "23 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102527:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00103993;
LAB_0010253b:
      iVar10 = -1;
    }
    greatest_test_post(iVar10);
  }
  iVar10 = greatest_test_pre("non_trivial_network1");
  if (iVar10 == 1) {
    net.nnodes = 0;
    net._4_4_ = 0;
    net.caps = (flow_t *)0x0;
    mf.payload._32_8_ = 0;
    mf.payload.field_1.list = (int32_t *)0x0;
    mf.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    mf.payload.field_1.curr_neigh = (int32_t *)0x0;
    mf.payload.field_1.flows = (flow_t *)0x0;
    mf.payload.field_1.height = (int32_t *)0x0;
    mf.nnodes = 0;
    mf.s = 0;
    mf.t = 0;
    mf.kind = MAXFLOW_ALGO_INVALID;
    result.nnodes = 0;
    result.s = 0;
    result.t = 0;
    result.maxflow = 0;
    result.colors = (int32_t *)0x0;
    flow_network_create(&net,7);
    max_flow_create(&mf,7,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&result,7);
    flow_net_set_cap(&net,0,3,2);
    flow_net_set_cap(&net,0,1,2);
    flow_net_set_cap(&net,0,4,2);
    flow_net_set_cap(&net,4,1,1);
    flow_net_set_cap(&net,1,3,1);
    flow_net_set_cap(&net,4,5,2);
    flow_net_set_cap(&net,1,5,2);
    flow_net_set_cap(&net,1,2,2);
    flow_net_set_cap(&net,3,2,1);
    flow_net_set_cap(&net,5,2,1);
    flow_net_set_cap(&net,2,6,2);
    flow_net_set_cap(&net,5,6,4);
    fVar4 = max_flow_single_pair(&net,&mf,0,6,&result);
    if (fVar4 == 5) {
      if (*result.colors != 0) {
        greatest_info.fail_line = 0x138;
        greatest_info.msg = "BLACK != result.colors[1 - 1]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102707;
      }
      if (result.colors[1] != 1) {
        greatest_info.fail_line = 0x139;
        greatest_info.msg = "WHITE != result.colors[2 - 1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_00102707;
      }
      if (result.colors[2] != 1) {
        greatest_info.fail_line = 0x13a;
        greatest_info.msg = "WHITE != result.colors[3 - 1]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_00102707;
      }
      if (result.colors[3] != 0) {
        greatest_info.fail_line = 0x13b;
        greatest_info.msg = "BLACK != result.colors[4 - 1]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_00102707;
      }
      if (result.colors[4] != 1) {
        greatest_info.fail_line = 0x13c;
        greatest_info.msg = "WHITE != result.colors[5 - 1]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_00102707;
      }
      if (result.colors[5] != 1) {
        greatest_info.fail_line = 0x13d;
        greatest_info.msg = "WHITE != result.colors[6 - 1]";
        greatest_info.assertions = greatest_info.assertions + 7;
        goto LAB_00102707;
      }
      greatest_info.assertions = greatest_info.assertions + 8;
      if (result.colors[6] != 1) {
        greatest_info.fail_line = 0x13e;
        greatest_info.msg = "WHITE != result.colors[7 - 1]";
        goto LAB_00102707;
      }
      iVar10 = 0;
      gVar3 = validate_with_slow_max_flow(&net,0,6,&result);
      if (gVar3 != GREATEST_TEST_RES_PASS) goto LAB_0010271b;
      max_flow_result_destroy(&result);
      max_flow_destroy(&mf);
      flow_network_destroy(&net);
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_line = 0x137;
      greatest_info.msg = "5 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102707:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00103993;
LAB_0010271b:
      iVar10 = -1;
    }
    greatest_test_post(iVar10);
  }
  iVar10 = greatest_test_pre("non_trivial_network2");
  if (iVar10 == 1) {
    net.nnodes = 0;
    net._4_4_ = 0;
    net.caps = (flow_t *)0x0;
    mf.payload._32_8_ = 0;
    mf.payload.field_1.list = (int32_t *)0x0;
    mf.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    mf.payload.field_1.curr_neigh = (int32_t *)0x0;
    mf.payload.field_1.flows = (flow_t *)0x0;
    mf.payload.field_1.height = (int32_t *)0x0;
    mf.nnodes = 0;
    mf.s = 0;
    mf.t = 0;
    mf.kind = MAXFLOW_ALGO_INVALID;
    result.nnodes = 0;
    result.s = 0;
    result.t = 0;
    result.maxflow = 0;
    result.colors = (int32_t *)0x0;
    flow_network_create(&net,7);
    max_flow_create(&mf,7,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&result,7);
    flow_net_set_cap(&net,0,1,6);
    flow_net_set_cap(&net,0,3,5);
    flow_net_set_cap(&net,0,4,10);
    flow_net_set_cap(&net,4,3,0xc);
    flow_net_set_cap(&net,3,1,5);
    flow_net_set_cap(&net,3,2,7);
    flow_net_set_cap(&net,1,2,5);
    flow_net_set_cap(&net,1,5,0xc);
    flow_net_set_cap(&net,1,5,0xc);
    flow_net_set_cap(&net,5,2,3);
    flow_net_set_cap(&net,5,6,0xf);
    flow_net_set_cap(&net,2,6,4);
    fVar4 = max_flow_single_pair(&net,&mf,0,6,&result);
    if (fVar4 == 0xf) {
      if (*result.colors != 0) {
        greatest_info.fail_line = 0x16a;
        greatest_info.msg = "BLACK != result.colors[1 - 1]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_001028ec;
      }
      if (result.colors[1] != 1) {
        greatest_info.fail_line = 0x16b;
        greatest_info.msg = "WHITE != result.colors[2 - 1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_001028ec;
      }
      if (result.colors[2] != 0) {
        greatest_info.fail_line = 0x16c;
        greatest_info.msg = "BLACK != result.colors[3 - 1]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_001028ec;
      }
      if (result.colors[3] != 0) {
        greatest_info.fail_line = 0x16d;
        greatest_info.msg = "BLACK != result.colors[4 - 1]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_001028ec;
      }
      if (result.colors[4] != 0) {
        greatest_info.fail_line = 0x16e;
        greatest_info.msg = "BLACK != result.colors[5 - 1]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_001028ec;
      }
      if (result.colors[5] != 1) {
        greatest_info.fail_line = 0x16f;
        greatest_info.msg = "WHITE != result.colors[6 - 1]";
        greatest_info.assertions = greatest_info.assertions + 7;
        goto LAB_001028ec;
      }
      greatest_info.assertions = greatest_info.assertions + 8;
      if (result.colors[6] != 1) {
        greatest_info.fail_line = 0x170;
        greatest_info.msg = "WHITE != result.colors[7 - 1]";
        goto LAB_001028ec;
      }
      iVar10 = 0;
      gVar3 = validate_with_slow_max_flow(&net,0,6,&result);
      if (gVar3 != GREATEST_TEST_RES_PASS) goto LAB_00102900;
      max_flow_result_destroy(&result);
      max_flow_destroy(&mf);
      flow_network_destroy(&net);
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_line = 0x169;
      greatest_info.msg = "15 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_001028ec:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00103993;
LAB_00102900:
      iVar10 = -1;
    }
    greatest_test_post(iVar10);
  }
  iVar10 = greatest_test_pre("non_trivial_network3");
  if (iVar10 == 1) {
    net.nnodes = 0;
    net._4_4_ = 0;
    net.caps = (flow_t *)0x0;
    mf.payload._32_8_ = 0;
    mf.payload.field_1.list = (int32_t *)0x0;
    mf.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    mf.payload.field_1.curr_neigh = (int32_t *)0x0;
    mf.payload.field_1.flows = (flow_t *)0x0;
    mf.payload.field_1.height = (int32_t *)0x0;
    mf.nnodes = 0;
    mf.s = 0;
    mf.t = 0;
    mf.kind = MAXFLOW_ALGO_INVALID;
    result.nnodes = 0;
    result.s = 0;
    result.t = 0;
    result.maxflow = 0;
    result.colors = (int32_t *)0x0;
    flow_network_create(&net,8);
    max_flow_create(&mf,8,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&result,8);
    flow_net_set_cap(&net,0,4,7);
    flow_net_set_cap(&net,0,1,3);
    flow_net_set_cap(&net,0,5,3);
    flow_net_set_cap(&net,5,1,5);
    flow_net_set_cap(&net,4,1,1);
    flow_net_set_cap(&net,1,2,2);
    flow_net_set_cap(&net,4,3,7);
    flow_net_set_cap(&net,3,1,2);
    flow_net_set_cap(&net,5,2,3);
    flow_net_set_cap(&net,5,6,3);
    flow_net_set_cap(&net,2,6,5);
    flow_net_set_cap(&net,2,3,2);
    flow_net_set_cap(&net,6,7,6);
    flow_net_set_cap(&net,3,7,5);
    fVar4 = max_flow_single_pair(&net,&mf,0,7,&result);
    if (fVar4 == 10) {
      if (*result.colors != 0) {
        greatest_info.fail_line = 0x19d;
        greatest_info.msg = "BLACK != result.colors[1 - 1]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102af3;
      }
      if (result.colors[1] != 0) {
        greatest_info.fail_line = 0x19e;
        greatest_info.msg = "BLACK != result.colors[2 - 1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_00102af3;
      }
      if (result.colors[2] != 1) {
        greatest_info.fail_line = 0x19f;
        greatest_info.msg = "WHITE != result.colors[3 - 1]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_00102af3;
      }
      if (result.colors[3] != 0) {
        greatest_info.fail_line = 0x1a0;
        greatest_info.msg = "BLACK != result.colors[4 - 1]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_00102af3;
      }
      if (result.colors[4] != 0) {
        greatest_info.fail_line = 0x1a1;
        greatest_info.msg = "BLACK != result.colors[5 - 1]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_00102af3;
      }
      if (result.colors[5] != 1) {
        greatest_info.fail_line = 0x1a2;
        greatest_info.msg = "WHITE != result.colors[6 - 1]";
        greatest_info.assertions = greatest_info.assertions + 7;
        goto LAB_00102af3;
      }
      if (result.colors[6] != 1) {
        greatest_info.fail_line = 0x1a3;
        greatest_info.msg = "WHITE != result.colors[7 - 1]";
        greatest_info.assertions = greatest_info.assertions + 8;
        goto LAB_00102af3;
      }
      greatest_info.assertions = greatest_info.assertions + 9;
      if (result.colors[7] != 1) {
        greatest_info.fail_line = 0x1a4;
        greatest_info.msg = "WHITE != result.colors[8 - 1]";
        goto LAB_00102af3;
      }
      iVar10 = 0;
      gVar3 = validate_with_slow_max_flow(&net,0,7,&result);
      if (gVar3 != GREATEST_TEST_RES_PASS) goto LAB_00102b07;
      max_flow_result_destroy(&result);
      max_flow_destroy(&mf);
      flow_network_destroy(&net);
      greatest_info.msg = (char *)0x0;
    }
    else {
      greatest_info.fail_line = 0x19c;
      greatest_info.msg = "10 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102af3:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00103993;
LAB_00102b07:
      iVar10 = -1;
    }
    greatest_test_post(iVar10);
  }
  iVar10 = greatest_test_pre("no_path_flow");
  if (iVar10 != 1) goto LAB_00103121;
  net.nnodes = 0;
  net._4_4_ = 0;
  net.caps = (flow_t *)0x0;
  mf.payload._32_8_ = 0;
  mf.payload.field_1.list = (int32_t *)0x0;
  mf.payload.field_0.temp_mf.colors = (int32_t *)0x0;
  mf.payload.field_1.curr_neigh = (int32_t *)0x0;
  mf.payload.field_1.flows = (flow_t *)0x0;
  mf.payload.field_1.height = (int32_t *)0x0;
  mf.nnodes = 0;
  mf.s = 0;
  mf.t = 0;
  mf.kind = MAXFLOW_ALGO_INVALID;
  result.nnodes = 0;
  result.s = 0;
  result.t = 0;
  result.maxflow = 0;
  result.colors = (int32_t *)0x0;
  flow_network_create(&net,4);
  max_flow_create(&mf,4,MAXFLOW_ALGO_PUSH_RELABEL);
  max_flow_result_create(&result,4);
  flow_net_set_cap(&net,0,1,2);
  flow_net_set_cap(&net,1,0,2);
  flow_net_set_cap(&net,1,2,2);
  flow_net_set_cap(&net,2,1,2);
  flow_net_set_cap(&net,2,0,2);
  flow_net_set_cap(&net,0,2,2);
  fVar4 = max_flow_single_pair(&net,&mf,0,3,&result);
  if (fVar4 == 0) {
    if (*result.colors != 0) {
      greatest_info.fail_line = 0x1ca;
      greatest_info.msg = "BLACK != result.colors[0]";
      greatest_info.assertions = greatest_info.assertions + 2;
      goto LAB_00103103;
    }
    if (result.colors[1] != 0) {
      greatest_info.fail_line = 0x1cb;
      greatest_info.msg = "BLACK != result.colors[1]";
      greatest_info.assertions = greatest_info.assertions + 3;
      goto LAB_00103103;
    }
    if (result.colors[2] != 0) {
      greatest_info.fail_line = 0x1cc;
      greatest_info.msg = "BLACK != result.colors[2]";
      greatest_info.assertions = greatest_info.assertions + 4;
      goto LAB_00103103;
    }
    greatest_info.assertions = greatest_info.assertions + 5;
    if (result.colors[3] != 1) {
      greatest_info.fail_line = 0x1cd;
      greatest_info.msg = "WHITE != result.colors[3]";
      goto LAB_00103103;
    }
    iVar10 = 0;
    gVar3 = validate_with_slow_max_flow(&net,0,3,&result);
    if (gVar3 != GREATEST_TEST_RES_PASS) goto LAB_00103117;
    max_flow_result_destroy(&result);
    max_flow_destroy(&mf);
    flow_network_destroy(&net);
    greatest_info.msg = (char *)0x0;
  }
  else {
    greatest_info.fail_line = 0x1c9;
    greatest_info.msg = "0 != max_flow";
    greatest_info.assertions = greatest_info.assertions + 1;
LAB_00103103:
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
    ;
    if ((greatest_info.flags & 4) != 0) {
LAB_00103993:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      abort();
    }
LAB_00103117:
    iVar10 = -1;
  }
  greatest_test_post(iVar10);
LAB_00103121:
  iVar10 = greatest_test_pre("single_path_flow");
  if (iVar10 == 1) {
    nnodes_00 = 2;
    iVar10 = 1;
    while( true ) {
      if (iVar10 == 9) break;
      net.nnodes = 0;
      net._4_4_ = 0;
      net.caps = (flow_t *)0x0;
      mf.payload._32_8_ = 0;
      mf.payload.field_1.list = (int32_t *)0x0;
      mf.payload.field_0.temp_mf.colors = (int32_t *)0x0;
      mf.payload.field_1.curr_neigh = (int32_t *)0x0;
      mf.payload.field_1.flows = (flow_t *)0x0;
      mf.payload.field_1.height = (int32_t *)0x0;
      mf.nnodes = 0;
      mf.s = 0;
      mf.t = 0;
      mf.kind = MAXFLOW_ALGO_INVALID;
      result.nnodes = 0;
      result.s = 0;
      result.t = 0;
      result.maxflow = 0;
      result.colors = (int32_t *)0x0;
      flow_network_create(&net,nnodes_00);
      max_flow_create(&mf,nnodes_00,MAXFLOW_ALGO_PUSH_RELABEL);
      max_flow_result_create(&result,nnodes_00);
      local_bc = 0x7fffffff;
      iVar8 = 0;
      iVar13 = iVar10;
      while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, bVar15) {
        iVar5 = rand();
        iVar5 = iVar5 % 10;
        iVar6 = rand();
        iVar11 = iVar8 + 1;
        flow_net_set_cap(&net,iVar8,iVar11,iVar5);
        flow_net_set_cap(&net,iVar11,iVar8,iVar6 % 10);
        iVar8 = iVar11;
        if (iVar5 <= local_bc) {
          local_bc = iVar5;
        }
      }
      fVar4 = max_flow_single_pair(&net,&mf,0,nnodes_00 + -1,&result);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (local_bc != fVar4) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
        ;
        greatest_info.fail_line = 499;
        greatest_info.msg = "min_cap != max_flow";
        if ((greatest_info.flags & 4) != 0) goto LAB_00103993;
LAB_001032c5:
        iVar10 = -1;
        goto LAB_001032c8;
      }
      gVar3 = validate_with_slow_max_flow(&net,0,nnodes_00 + -1,&result);
      if (gVar3 != GREATEST_TEST_RES_PASS) goto LAB_001032c5;
      max_flow_result_destroy(&result);
      max_flow_destroy(&mf);
      flow_network_destroy(&net);
      nnodes_00 = nnodes_00 + 1;
      iVar10 = iVar10 + 1;
    }
    greatest_info.msg = (char *)0x0;
    iVar10 = 0;
LAB_001032c8:
    greatest_test_post(iVar10);
  }
  iVar10 = greatest_test_pre("two_path_flow");
  if (iVar10 == 1) {
    iVar10 = 2;
    while( true ) {
      if (iVar10 == 5) break;
      i_00 = iVar10 * 2;
      iVar8 = iVar10 * 2 + 2;
      net.nnodes = 0;
      net._4_4_ = 0;
      net.caps = (flow_t *)0x0;
      mf.payload._32_8_ = 0;
      mf.payload.field_1.list = (int32_t *)0x0;
      mf.payload.field_0.temp_mf.colors = (int32_t *)0x0;
      mf.payload.field_1.curr_neigh = (int32_t *)0x0;
      mf.payload.field_1.flows = (flow_t *)0x0;
      mf.payload.field_1.height = (int32_t *)0x0;
      mf.nnodes = 0;
      mf.s = 0;
      mf.t = 0;
      mf.kind = MAXFLOW_ALGO_INVALID;
      result.nnodes = 0;
      result.s = 0;
      result.t = 0;
      result.maxflow = 0;
      result.colors = (int32_t *)0x0;
      flow_network_create(&net,iVar8);
      max_flow_create(&mf,iVar8,MAXFLOW_ALGO_PUSH_RELABEL);
      max_flow_result_create(&result,iVar8);
      iVar13 = iVar10 * 2 + 1;
      flow_net_set_cap(&net,0,1,99999);
      flow_net_set_cap(&net,0,2,99999);
      flow_net_set_cap(&net,iVar10 * 2 + -1,iVar13,99999);
      flow_net_set_cap(&net,i_00,iVar13,99999);
      uVar14 = 1;
      iVar8 = 0x7fffffff;
      while (uVar14 < i_00) {
        iVar5 = rand();
        iVar5 = iVar5 % 10;
        iVar6 = rand();
        uVar9 = uVar14 + 2;
        flow_net_set_cap(&net,uVar14,uVar9,iVar5);
        flow_net_set_cap(&net,uVar9,uVar14,iVar6 % 10);
        uVar14 = uVar9;
        if (iVar5 <= iVar8) {
          iVar8 = iVar5;
        }
      }
      uVar12 = 0x7fffffff;
      uVar14 = 2;
      while (uVar14 < i_00) {
        iVar5 = rand();
        iVar6 = rand();
        uVar9 = uVar14 + 2;
        iVar11 = (int)((long)iVar5 % 10);
        flow_net_set_cap(&net,uVar14,uVar9,iVar11);
        flow_net_set_cap(&net,uVar9,uVar14,iVar6 % 10);
        uVar14 = uVar9;
        if (iVar11 <= (int)uVar12) {
          uVar12 = (long)iVar5 % 10 & 0xffffffff;
        }
      }
      fVar4 = max_flow_single_pair(&net,&mf,0,iVar13,&result);
      greatest_info.assertions = greatest_info.assertions + 1;
      if ((int)uVar12 + iVar8 != fVar4) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
        ;
        greatest_info.fail_line = 0x236;
        greatest_info.msg = "min_cap1 + min_cap2 != max_flow";
        if ((greatest_info.flags & 4) != 0) goto LAB_00103993;
LAB_00103533:
        iVar10 = -1;
        goto LAB_00103536;
      }
      gVar3 = validate_with_slow_max_flow(&net,0,iVar13,&result);
      if (gVar3 != GREATEST_TEST_RES_PASS) goto LAB_00103533;
      max_flow_result_destroy(&result);
      max_flow_destroy(&mf);
      flow_network_destroy(&net);
      iVar10 = iVar10 + 1;
    }
    greatest_info.msg = (char *)0x0;
    iVar10 = 0;
LAB_00103536:
    greatest_test_post(iVar10);
  }
  iVar10 = greatest_test_pre("random_networks");
  if (iVar10 == 1) {
    for (iVar10 = 2; iVar10 != 0xb; iVar10 = iVar10 + 1) {
      iVar13 = iVar10 + -1;
      for (iVar8 = 0; iVar8 != 0x800; iVar8 = iVar8 + 1) {
        net.nnodes = 0;
        net._4_4_ = 0;
        net.caps = (flow_t *)0x0;
        mf.payload._32_8_ = 0;
        mf.payload.field_1.list = (int32_t *)0x0;
        mf.payload.field_0.temp_mf.colors = (int32_t *)0x0;
        mf.payload.field_1.curr_neigh = (int32_t *)0x0;
        mf.payload.field_1.flows = (flow_t *)0x0;
        mf.payload.field_1.height = (int32_t *)0x0;
        mf.nnodes = 0;
        mf.s = 0;
        mf.t = 0;
        mf.kind = MAXFLOW_ALGO_INVALID;
        result.nnodes = 0;
        result.s = 0;
        result.t = 0;
        result.maxflow = 0;
        result.colors = (int32_t *)0x0;
        flow_network_create(&net,iVar10);
        max_flow_create(&mf,iVar10,MAXFLOW_ALGO_PUSH_RELABEL);
        max_flow_result_create(&result,iVar10);
        for (iVar5 = 0; iVar5 != iVar10; iVar5 = iVar5 + 1) {
          for (iVar6 = 0; iVar10 != iVar6; iVar6 = iVar6 + 1) {
            if (iVar5 != iVar6) {
              iVar11 = rand();
              flow_net_set_cap(&net,iVar5,iVar6,
                               *(flow_t *)(&DAT_00106080 + ((ulong)(long)iVar11 % 7) * 4));
            }
          }
        }
        fVar4 = max_flow_single_pair(&net,&mf,0,iVar13,&result);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (fVar4 != result.maxflow) {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
          ;
          greatest_info.fail_line = 0x25f;
          greatest_info.msg = "max_flow != result.maxflow";
          if ((greatest_info.flags & 4) != 0) goto LAB_00103993;
LAB_001036cb:
          iVar10 = -1;
          goto LAB_001036ce;
        }
        gVar3 = validate_with_slow_max_flow(&net,0,iVar13,&result);
        if ((gVar3 != GREATEST_TEST_RES_PASS) ||
           (gVar3 = validate_with_slow_max_flow(&net,0,iVar13,&result),
           gVar3 != GREATEST_TEST_RES_PASS)) goto LAB_001036cb;
        max_flow_result_destroy(&result);
        max_flow_destroy(&mf);
        flow_network_destroy(&net);
      }
    }
    greatest_info.msg = (char *)0x0;
    iVar10 = 0;
LAB_001036ce:
    greatest_test_post(iVar10);
  }
  GREATEST_PRINT_REPORT();
  return (int)(greatest_info.failed != 0);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}